

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O0

int cs_impl::list_cs_ext::init(EVP_PKEY_CTX *ctx)

{
  int iVar1;
  name_space *func;
  string *name;
  namespace_t *in_stack_fffffffffffffaa8;
  __shared_ptr_access<cs::name_space,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_fffffffffffffab0;
  allocator *paVar2;
  string *in_stack_fffffffffffffab8;
  name_space *in_stack_fffffffffffffac0;
  name_space *this;
  undefined8 in_stack_fffffffffffffad0;
  types type;
  _func_numeric_list<cs_impl::any,_std::allocator<cs_impl::any>_>_ptr *in_stack_fffffffffffffad8;
  undefined8 in_stack_fffffffffffffae0;
  undefined1 uVar3;
  _func__List_iterator<cs_impl::any>_list<cs_impl::any,_std::allocator<cs_impl::any>_>_ptr__List_iterator<cs_impl::any>_ptr_any_ptr
  *in_stack_fffffffffffffae8;
  allocator local_3f1;
  string local_3f0 [47];
  undefined1 local_3c1 [48];
  allocator local_391;
  string local_390 [47];
  allocator local_361;
  string local_360 [47];
  allocator local_331;
  string local_330 [47];
  allocator local_301;
  string local_300 [47];
  allocator local_2d1;
  string local_2d0 [47];
  allocator local_2a1;
  string local_2a0 [47];
  allocator local_271;
  string local_270 [47];
  allocator local_241;
  string local_240 [47];
  allocator local_211;
  string local_210 [47];
  allocator local_1e1;
  string local_1e0 [47];
  allocator local_1b1;
  string local_1b0 [47];
  allocator local_181;
  string local_180 [47];
  allocator local_151;
  string local_150 [47];
  allocator local_121;
  string local_120 [47];
  allocator local_f1;
  string local_f0 [47];
  allocator local_c1;
  string local_c0 [47];
  allocator local_91;
  string local_90 [47];
  allocator local_61;
  string local_60 [63];
  allocator local_21;
  string local_20 [32];
  
  uVar3 = (undefined1)((ulong)in_stack_fffffffffffffae0 >> 0x38);
  type = (types)((ulong)in_stack_fffffffffffffad0 >> 0x20);
  std::__shared_ptr_access<cs::name_space,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            (in_stack_fffffffffffffab0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_20,"next",&local_21);
  cs::make_cni<std::_List_iterator<cs_impl::any>(&)(std::_List_iterator<cs_impl::any>&)>
            ((_func__List_iterator<cs_impl::any>__List_iterator<cs_impl::any>_ptr *)
             in_stack_fffffffffffffae8,(bool)uVar3);
  cs::name_space::add_var
            (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,(var *)in_stack_fffffffffffffab0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"prev",&local_61);
  cs::make_cni<std::_List_iterator<cs_impl::any>(&)(std::_List_iterator<cs_impl::any>&)>
            ((_func__List_iterator<cs_impl::any>__List_iterator<cs_impl::any>_ptr *)
             in_stack_fffffffffffffae8,(bool)uVar3);
  cs::name_space::add_var
            (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,(var *)in_stack_fffffffffffffab0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"data",&local_91);
  cs::make_cni<cs_impl::any(&)(std::_List_iterator<cs_impl::any>&)>
            ((_func_any__List_iterator<cs_impl::any>_ptr *)in_stack_fffffffffffffad8,type);
  cs::name_space::add_var
            (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,(var *)in_stack_fffffffffffffab0);
  any::~any((any *)0x44322f);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  any::~any((any *)0x443256);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  any::~any((any *)0x44327d);
  std::__cxx11::string::~string(local_20);
  std::allocator<char>::~allocator((allocator<char> *)&local_21);
  std::__shared_ptr_access<cs::name_space,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            (in_stack_fffffffffffffab0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"iterator",&local_c1);
  cs::make_namespace(in_stack_fffffffffffffaa8);
  cs::name_space::add_var
            (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,(var *)in_stack_fffffffffffffab0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"front",&local_f1);
  cs::make_cni<cs_impl::any(&)(std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>const&)>
            ((_func_any_list<cs_impl::any,_std::allocator<cs_impl::any>_>_ptr *)
             in_stack_fffffffffffffad8,type);
  cs::name_space::add_var
            (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,(var *)in_stack_fffffffffffffab0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_120,"back",&local_121);
  cs::make_cni<cs_impl::any(&)(std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>const&)>
            ((_func_any_list<cs_impl::any,_std::allocator<cs_impl::any>_>_ptr *)
             in_stack_fffffffffffffad8,type);
  cs::name_space::add_var
            (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,(var *)in_stack_fffffffffffffab0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_150,"begin",&local_151);
  cs::
  make_cni<std::_List_iterator<cs_impl::any>(&)(std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>&)>
            ((_func__List_iterator<cs_impl::any>_list<cs_impl::any,_std::allocator<cs_impl::any>_>_ptr
              *)in_stack_fffffffffffffad8,type);
  cs::name_space::add_var
            (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,(var *)in_stack_fffffffffffffab0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"end",&local_181);
  cs::
  make_cni<std::_List_iterator<cs_impl::any>(&)(std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>&)>
            ((_func__List_iterator<cs_impl::any>_list<cs_impl::any,_std::allocator<cs_impl::any>_>_ptr
              *)in_stack_fffffffffffffad8,type);
  cs::name_space::add_var
            (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,(var *)in_stack_fffffffffffffab0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b0,"empty",&local_1b1);
  cs::make_cni<bool(&)(std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>const&)>
            ((_func_bool_list<cs_impl::any,_std::allocator<cs_impl::any>_>_ptr *)
             in_stack_fffffffffffffae8,(bool)uVar3);
  cs::name_space::add_var
            (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,(var *)in_stack_fffffffffffffab0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e0,"size",&local_1e1);
  cs::make_cni<cs::numeric(&)(std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>const&)>
            (in_stack_fffffffffffffad8,type);
  cs::name_space::add_var
            (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,(var *)in_stack_fffffffffffffab0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_210,"clear",&local_211);
  cs::make_cni<void(&)(std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>&)>
            ((_func_void_list<cs_impl::any,_std::allocator<cs_impl::any>_>_ptr *)
             in_stack_fffffffffffffae8,(bool)uVar3);
  cs::name_space::add_var
            (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,(var *)in_stack_fffffffffffffab0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_240,"insert",&local_241);
  cs::
  make_cni<std::_List_iterator<cs_impl::any>(&)(std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>&,std::_List_iterator<cs_impl::any>&,cs_impl::any_const&)>
            (in_stack_fffffffffffffae8,(bool)uVar3);
  cs::name_space::add_var
            (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,(var *)in_stack_fffffffffffffab0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_270,"erase",&local_271);
  cs::
  make_cni<std::_List_iterator<cs_impl::any>(&)(std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>&,std::_List_iterator<cs_impl::any>&)>
            ((_func__List_iterator<cs_impl::any>_list<cs_impl::any,_std::allocator<cs_impl::any>_>_ptr__List_iterator<cs_impl::any>_ptr
              *)in_stack_fffffffffffffae8,(bool)uVar3);
  cs::name_space::add_var
            (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,(var *)in_stack_fffffffffffffab0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a0,"push_front",&local_2a1);
  cs::
  make_cni<void(&)(std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>&,cs_impl::any_const&)>
            ((_func_void_list<cs_impl::any,_std::allocator<cs_impl::any>_>_ptr_any_ptr *)
             in_stack_fffffffffffffae8,(bool)uVar3);
  cs::name_space::add_var
            (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,(var *)in_stack_fffffffffffffab0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2d0,"pop_front",&local_2d1);
  cs::make_cni<cs_impl::any(&)(std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>&)>
            ((_func_any_list<cs_impl::any,_std::allocator<cs_impl::any>_>_ptr *)
             in_stack_fffffffffffffae8,(bool)uVar3);
  cs::name_space::add_var
            (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,(var *)in_stack_fffffffffffffab0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_300,"push_back",&local_301);
  cs::
  make_cni<void(&)(std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>&,cs_impl::any_const&)>
            ((_func_void_list<cs_impl::any,_std::allocator<cs_impl::any>_>_ptr_any_ptr *)
             in_stack_fffffffffffffae8,(bool)uVar3);
  cs::name_space::add_var
            (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,(var *)in_stack_fffffffffffffab0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_330,"pop_back",&local_331);
  cs::make_cni<cs_impl::any(&)(std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>&)>
            ((_func_any_list<cs_impl::any,_std::allocator<cs_impl::any>_>_ptr *)
             in_stack_fffffffffffffae8,(bool)uVar3);
  func = cs::name_space::add_var
                   (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                    (var *)in_stack_fffffffffffffab0);
  paVar2 = &local_361;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_360,"remove",paVar2);
  uVar3 = (undefined1)((ulong)paVar2 >> 0x38);
  cs::
  make_cni<void(&)(std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>&,cs_impl::any_const&)>
            ((_func_void_list<cs_impl::any,_std::allocator<cs_impl::any>_>_ptr_any_ptr *)func,
             (bool)uVar3);
  cs::name_space::add_var
            (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,(var *)in_stack_fffffffffffffab0);
  paVar2 = &local_391;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_390,"reverse",paVar2);
  cs::make_cni<void(&)(std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>&)>
            ((_func_void_list<cs_impl::any,_std::allocator<cs_impl::any>_>_ptr *)func,(bool)uVar3);
  cs::name_space::add_var
            (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,(var *)in_stack_fffffffffffffab0);
  this = (name_space *)local_3c1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_3c1 + 1),"unique",(allocator *)this);
  cs::make_cni<void(&)(std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>&)>
            ((_func_void_list<cs_impl::any,_std::allocator<cs_impl::any>_>_ptr *)func,(bool)uVar3);
  name = (string *)
         cs::name_space::add_var(this,in_stack_fffffffffffffab8,(var *)in_stack_fffffffffffffab0);
  paVar2 = &local_3f1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3f0,"sort",paVar2);
  cs::
  make_cni<void(&)(std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>&,cs_impl::any_const&)>
            ((_func_void_list<cs_impl::any,_std::allocator<cs_impl::any>_>_ptr_any_ptr *)func,
             (bool)uVar3);
  cs::name_space::add_var(this,name,(var *)paVar2);
  any::~any((any *)0x443a8b);
  std::__cxx11::string::~string(local_3f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
  any::~any((any *)0x443ab2);
  std::__cxx11::string::~string((string *)(local_3c1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_3c1);
  any::~any((any *)0x443ad9);
  std::__cxx11::string::~string(local_390);
  std::allocator<char>::~allocator((allocator<char> *)&local_391);
  any::~any((any *)0x443b00);
  std::__cxx11::string::~string(local_360);
  std::allocator<char>::~allocator((allocator<char> *)&local_361);
  any::~any((any *)0x443b27);
  std::__cxx11::string::~string(local_330);
  std::allocator<char>::~allocator((allocator<char> *)&local_331);
  any::~any((any *)0x443b4e);
  std::__cxx11::string::~string(local_300);
  std::allocator<char>::~allocator((allocator<char> *)&local_301);
  any::~any((any *)0x443b75);
  std::__cxx11::string::~string(local_2d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
  any::~any((any *)0x443b9c);
  std::__cxx11::string::~string(local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  any::~any((any *)0x443bc3);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  any::~any((any *)0x443bea);
  std::__cxx11::string::~string(local_240);
  std::allocator<char>::~allocator((allocator<char> *)&local_241);
  any::~any((any *)0x443c11);
  std::__cxx11::string::~string(local_210);
  std::allocator<char>::~allocator((allocator<char> *)&local_211);
  any::~any((any *)0x443c38);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  any::~any((any *)0x443c5f);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  any::~any((any *)0x443c86);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  any::~any((any *)0x443cad);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  any::~any((any *)0x443cd4);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  any::~any((any *)0x443cfb);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  any::~any((any *)0x443d22);
  std::__cxx11::string::~string(local_c0);
  iVar1 = std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  return iVar1;
}

Assistant:

void init()
		{
			(*list_iterator_ext)
			.add_var("next", make_cni(next, true))
			.add_var("prev", make_cni(prev, true))
			.add_var("data", make_cni(data, callable::types::member_visitor));
			(*list_ext)
			.add_var("iterator", make_namespace(list_iterator_ext))
			.add_var("front", make_cni(front, callable::types::member_visitor))
			.add_var("back", make_cni(back, callable::types::member_visitor))
			.add_var("begin", make_cni(begin, callable::types::member_visitor))
			.add_var("end", make_cni(end, callable::types::member_visitor))
			.add_var("empty", make_cni(empty, true))
			.add_var("size", make_cni(size, callable::types::member_visitor))
			.add_var("clear", make_cni(clear, true))
			.add_var("insert", make_cni(insert, true))
			.add_var("erase", make_cni(erase, true))
			.add_var("push_front", make_cni(push_front, true))
			.add_var("pop_front", make_cni(pop_front, true))
			.add_var("push_back", make_cni(push_back, true))
			.add_var("pop_back", make_cni(pop_back, true))
			.add_var("remove", make_cni(remove, true))
			.add_var("reverse", make_cni(reverse, true))
			.add_var("unique", make_cni(unique, true))
			.add_var("sort", make_cni(sort, true));
		}